

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
* __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::try_emplace<double>
          (pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
           *__return_storage_ptr__,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          string_view_type *key,double *args)

{
  byte bVar1;
  sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
  *this_00;
  not_an_object *this_01;
  type tVar2;
  
  for (; bVar1 = (byte)*(object_storage *)this & 0xf, bVar1 == 9;
      this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)((long)this + 8))
  {
  }
  if (bVar1 != 0xd) {
    if (bVar1 != 4) {
      this_01 = (not_an_object *)__cxa_allocate_exception(0x58);
      not_an_object::not_an_object<char>(this_01,key->_M_str,key->_M_len);
      __cxa_throw(this_01,&not_an_object::typeinfo,not_an_object::~not_an_object);
    }
    create_object_implicitly(this);
  }
  this_00 = (sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
             *)basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
               value_abi_cxx11_((object_storage *)this);
  tVar2 = sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
          ::try_emplace<std::allocator<char>,double>(this_00,key,args);
  (__return_storage_ptr__->first).it_._M_current = tVar2.first._M_current._M_current;
  (__return_storage_ptr__->first).has_value_ = true;
  __return_storage_ptr__->second = tVar2.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<object_iterator,bool> try_emplace(const string_view_type& key, Args&&... args)
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                {
                    create_object_implicitly();
                    auto result = cast<object_storage>().value().try_emplace(key, std::forward<Args>(args)...);
                    return std::make_pair(object_iterator(result.first),result.second);
                }
                case json_storage_kind::object:
                {
                    auto result = cast<object_storage>().value().try_emplace(key, std::forward<Args>(args)...);
                    return std::make_pair(object_iterator(result.first),result.second);
                }
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().try_emplace(key, std::forward<Args>(args)...);
                default:
                    JSONCONS_THROW(not_an_object(key.data(),key.length()));
            }
        }